

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocalsocket_unix.cpp
# Opt level: O0

bool QLocalSocketPrivate::parseSockaddr
               (sockaddr_un *addr,uint len,QString *fullServerName,QString *serverName,
               bool *abstractNamespace)

{
  QByteArrayView ba;
  Flags flags;
  bool bVar1;
  qsizetype qVar2;
  QString *in_RCX;
  EncodedData<QByteArrayView> *in_RDX;
  uint in_ESI;
  short *in_RDI;
  byte *in_R8;
  long in_FS_OFFSET;
  int truncPos;
  QString name;
  QByteArrayView textData;
  QStringDecoder toUtf16;
  undefined4 in_stack_fffffffffffffef8;
  char in_stack_fffffffffffffefc;
  undefined2 in_stack_fffffffffffffefd;
  undefined1 in_stack_fffffffffffffeff;
  EncodedData<QByteArrayView> *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 uVar3;
  undefined2 in_stack_ffffffffffffff0c;
  undefined2 uVar4;
  undefined2 in_stack_ffffffffffffff0e;
  QChar c;
  undefined1 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff11;
  undefined1 in_stack_ffffffffffffff12;
  byte bVar5;
  undefined4 in_stack_ffffffffffffff14;
  int iVar6;
  bool local_bb;
  QChar local_ba;
  undefined1 local_b8 [24];
  char16_t local_a0;
  char16_t local_9e;
  char16_t local_9c;
  char16_t local_9a;
  undefined8 local_98;
  undefined8 local_90;
  QString local_70;
  undefined8 local_58;
  undefined8 local_50;
  QStringConverter local_40;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI < 3) {
    local_bb = false;
  }
  else {
    bVar5 = false;
    if (*in_RDI == 1) {
      bVar5 = (char)in_RDI[1] == '\0';
    }
    *in_R8 = bVar5;
    memset(&local_40,0xaa,0x38);
    QFlags<QStringConverterBase::Flag>::QFlags
              ((QFlags<QStringConverterBase::Flag> *)in_stack_ffffffffffffff00,
               CONCAT13(in_stack_fffffffffffffeff,
                        CONCAT21(in_stack_fffffffffffffefd,in_stack_fffffffffffffefc)));
    flags.super_QFlagsStorageHelper<QStringConverterBase::Flag,_4>.
    super_QFlagsStorage<QStringConverterBase::Flag>.i._2_2_ = in_stack_ffffffffffffff0e;
    flags.super_QFlagsStorageHelper<QStringConverterBase::Flag,_4>.
    super_QFlagsStorage<QStringConverterBase::Flag>.i._0_2_ = in_stack_ffffffffffffff0c;
    QStringDecoder::QStringDecoder
              ((QStringDecoder *)in_stack_ffffffffffffff00,
               CONCAT13(in_stack_fffffffffffffeff,
                        CONCAT21(in_stack_fffffffffffffefd,in_stack_fffffffffffffefc)),flags);
    local_58 = 0xaaaaaaaaaaaaaaaa;
    local_50 = 0xaaaaaaaaaaaaaaaa;
    QByteArrayView::QByteArrayView<char,_true>
              ((QByteArrayView *)
               CONCAT44(in_stack_ffffffffffffff14,
                        CONCAT13(bVar5,CONCAT12(in_stack_ffffffffffffff12,
                                                CONCAT11(in_stack_ffffffffffffff11,
                                                         in_stack_ffffffffffffff10)))),
               (char *)CONCAT26(in_stack_ffffffffffffff0e,
                                CONCAT24(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08)),
               (qsizetype)in_stack_ffffffffffffff00);
    local_70.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_70.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    local_70.d.size = -0x5555555555555556;
    local_98 = local_58;
    local_90 = local_50;
    ba.m_data._0_4_ = in_stack_ffffffffffffff08;
    ba.m_size = (qsizetype)in_stack_ffffffffffffff00;
    ba.m_data._4_2_ = in_stack_ffffffffffffff0c;
    ba.m_data._6_2_ = in_stack_ffffffffffffff0e;
    QStringDecoder::operator()
              ((QStringDecoder *)
               CONCAT17(in_stack_fffffffffffffeff,
                        CONCAT25(in_stack_fffffffffffffefd,
                                 CONCAT14(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8))),ba)
    ;
    QStringDecoder::EncodedData::operator_cast_to_QString(in_stack_ffffffffffffff00);
    bVar1 = QString::isEmpty((QString *)0x388b4f);
    if ((!bVar1) && (bVar1 = QStringConverter::hasError(&local_40), !bVar1)) {
      bVar1 = false;
      if ((*in_R8 & 1) == 0) {
        QString::size(&local_70);
        local_9a = (char16_t)
                   QString::at((QString *)
                               CONCAT26(in_stack_ffffffffffffff0e,
                                        CONCAT24(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08
                                                )),(qsizetype)in_stack_ffffffffffffff00);
        local_9c = (char16_t)QChar::fromLatin1(in_stack_fffffffffffffefc);
        bVar1 = ::operator==((QChar *)in_stack_ffffffffffffff00,
                             (QChar *)CONCAT17(in_stack_fffffffffffffeff,
                                               CONCAT25(in_stack_fffffffffffffefd,
                                                        CONCAT14(in_stack_fffffffffffffefc,
                                                                 in_stack_fffffffffffffef8))));
      }
      if (bVar1 != false) {
        qVar2 = QString::size(&local_70);
        iVar6 = (int)qVar2;
        do {
          iVar6 = iVar6 + -1;
          bVar1 = false;
          if (0 < iVar6) {
            local_9e = (char16_t)
                       QString::at((QString *)
                                   CONCAT26(in_stack_ffffffffffffff0e,
                                            CONCAT24(in_stack_ffffffffffffff0c,
                                                     in_stack_ffffffffffffff08)),
                                   (qsizetype)in_stack_ffffffffffffff00);
            local_a0 = (char16_t)QChar::fromLatin1(in_stack_fffffffffffffefc);
            bVar1 = ::operator==((QChar *)in_stack_ffffffffffffff00,
                                 (QChar *)CONCAT17(in_stack_fffffffffffffeff,
                                                   CONCAT25(in_stack_fffffffffffffefd,
                                                            CONCAT14(in_stack_fffffffffffffefc,
                                                                     in_stack_fffffffffffffef8))));
          }
        } while (bVar1 != false);
        QString::truncate((longlong)&local_70);
      }
      QString::operator=((QString *)in_RDX,(QString *)&local_70);
      if ((*in_R8 & 1) == 0) {
        uVar3 = SUB84(in_RDX,0);
        uVar4 = (undefined2)((ulong)in_RDX >> 0x20);
        c.ucs = (char16_t)((ulong)in_RDX >> 0x30);
        in_stack_ffffffffffffff00 = in_RDX;
        QChar::QChar<char16_t,_true>(&local_ba,L'/');
        QString::lastIndexOf
                  ((QString *)in_stack_ffffffffffffff00,c,
                   CONCAT13(in_stack_fffffffffffffeff,
                            CONCAT21(in_stack_fffffffffffffefd,in_stack_fffffffffffffefc)));
        QString::mid((longlong)local_b8,CONCAT26(c.ucs,CONCAT24(uVar4,uVar3)));
      }
      else {
        QString::QString((QString *)in_stack_ffffffffffffff00,
                         (QString *)
                         CONCAT17(in_stack_fffffffffffffeff,
                                  CONCAT25(in_stack_fffffffffffffefd,
                                           CONCAT14(in_stack_fffffffffffffefc,
                                                    in_stack_fffffffffffffef8))));
      }
      QString::operator=((QString *)in_stack_ffffffffffffff00,
                         (QString *)
                         CONCAT17(in_stack_fffffffffffffeff,
                                  CONCAT25(in_stack_fffffffffffffefd,
                                           CONCAT14(in_stack_fffffffffffffefc,
                                                    in_stack_fffffffffffffef8))));
      QString::~QString((QString *)0x388cf1);
      bVar1 = QString::isEmpty((QString *)0x388cfb);
      if (bVar1) {
        QString::operator=(in_RCX,(QString *)in_RDX);
      }
    }
    local_bb = true;
    QString::~QString((QString *)0x388d24);
    QStringDecoder::~QStringDecoder((QStringDecoder *)0x388d31);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_bb;
  }
  __stack_chk_fail();
}

Assistant:

bool QLocalSocketPrivate::parseSockaddr(const struct ::sockaddr_un &addr,
                                        uint len,
                                        QString &fullServerName,
                                        QString &serverName,
                                        bool &abstractNamespace)
{
    if (len <= offsetof(::sockaddr_un, sun_path))
        return false;
    len -= offsetof(::sockaddr_un, sun_path);
    // check for abstract socket address
    abstractNamespace = PlatformSupportsAbstractNamespace
                                 && (addr.sun_family == PF_UNIX && addr.sun_path[0] == 0);
    QStringDecoder toUtf16(QStringDecoder::System, QStringDecoder::Flag::Stateless);
    // An abstract socket address can be arbitrary binary. To properly handle such a case,
    // we'd have to add new access functions for this very specific case. Instead, we just
    // attempt to decode it according to OS text encoding. If it fails we ignore the result.
    QByteArrayView textData(addr.sun_path + (abstractNamespace ? 1 : 0),
                            len - (abstractNamespace ? 1 : 0));
    QString name = toUtf16(textData);
    if (!name.isEmpty() && !toUtf16.hasError()) {
        //conversion encodes the trailing zeros. So, in case of non-abstract namespace we
        //chop them off as \0 character is not allowed in filenames
        if (!abstractNamespace && (name.at(name.size() - 1) == QChar::fromLatin1('\0'))) {
            int truncPos = name.size() - 1;
            while (truncPos > 0 && name.at(truncPos - 1) == QChar::fromLatin1('\0'))
                truncPos--;
            name.truncate(truncPos);
        }
        fullServerName = name;
        serverName = abstractNamespace
                     ? name
                     : fullServerName.mid(fullServerName.lastIndexOf(u'/') + 1);
        if (serverName.isEmpty())
            serverName = fullServerName;
    }
    return true;
}